

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toms462.cpp
# Opt level: O0

double bivnor(double ah,double ak,double r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_f0;
  double wk;
  double wh;
  double w2;
  double t;
  double sqr;
  double sp;
  double sn;
  double sgn;
  double s2;
  double s1;
  double rr;
  int is;
  int i;
  double h4;
  double h2;
  double gw;
  double gk;
  double gh;
  double g2;
  double ex;
  double conex;
  double con;
  double cn;
  double b;
  double ap;
  double a2;
  double r_local;
  double ak_local;
  double ah_local;
  
  h2 = 0.0;
  rr._0_4_ = 0;
  wk = 0.0;
  local_f0 = 0.0;
  cn = 0.0;
  dVar1 = gauss(-ah);
  dVar1 = dVar1 / 2.0;
  dVar2 = gauss(-ak);
  dVar2 = dVar2 / 2.0;
  if ((r != 0.0) || (NAN(r))) {
    dVar3 = (r + 1.0) * (1.0 - r);
    if (dVar3 < 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"BIVNOR - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  1 < |R|.\n");
      exit(0);
    }
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      dVar3 = sqrt(dVar3);
      if (bivnor::idig == 0xf) {
        conex = (bivnor::twopi * 1e-15) / 2.0;
      }
      else {
        conex = bivnor::twopi / 2.0;
        for (rr._4_4_ = 1; rr._4_4_ <= bivnor::idig; rr._4_4_ = rr._4_4_ + 1) {
          conex = conex / 10.0;
        }
      }
      if ((((ah != 0.0) || (NAN(ah))) || (ak != 0.0)) || (NAN(ak))) {
        if (((ah != 0.0) || (NAN(ah))) || ((ak == 0.0 && (!NAN(ak))))) {
          if (((ah == 0.0) && (!NAN(ah))) || ((ak != 0.0 || (NAN(ak))))) {
            if (((ah != 0.0) || (NAN(ah))) && ((ak != 0.0 || (NAN(ak))))) {
              cn = dVar1 + dVar2;
              if (ah * ak < 0.0) {
                cn = cn - 0.5;
              }
              wk = -ah;
              local_f0 = (ak / ah - r) / dVar3;
              h2 = dVar1 * 2.0;
              rr._0_4_ = -1;
            }
          }
          else {
            wk = -ah;
            local_f0 = (ak / ah - r) / dVar3;
            h2 = dVar1 * 2.0;
            rr._0_4_ = -1;
            cn = dVar1;
          }
        }
        else {
          wk = -ak;
          local_f0 = (ah / ak - r) / dVar3;
          h2 = dVar2 * 2.0;
          rr._0_4_ = 1;
          cn = dVar2;
        }
        while( true ) {
          sn = -1.0;
          if ((local_f0 != 0.0) || (NAN(local_f0))) {
            dVar1 = r8_abs(local_f0);
            if ((dVar1 != 1.0) || (NAN(dVar1))) {
              dVar1 = r8_abs(local_f0);
              if (1.0 < dVar1) {
                sn = 1.0;
                wk = wk * local_f0;
                dVar1 = gauss(wk);
                local_f0 = 1.0 / local_f0;
                if (local_f0 < 0.0) {
                  cn = cn + 0.5;
                }
                cn = h2 * dVar1 + (cn - (h2 + dVar1) / 2.0);
              }
              dVar1 = (wk * wk) / 2.0;
              dVar4 = exp(-dVar1);
              wh = dVar1 * dVar4;
              b = 1.0;
              sgn = 1.0 - dVar4;
              sqr = 1.0;
              s2 = 0.0;
              sp = 0.0;
              dVar4 = r8_abs(conex / local_f0);
              while( true ) {
                dVar5 = (b * sgn) / (sp + sqr);
                s2 = s2 + dVar5;
                dVar5 = r8_abs(dVar5);
                if (dVar5 <= dVar4) break;
                sp = sqr;
                sqr = sqr + 1.0;
                sgn = sgn - wh;
                wh = (wh * dVar1) / sqr;
                b = -b * local_f0 * local_f0;
              }
              dVar1 = atan(local_f0);
              cn = sn * ((-local_f0 * s2 + dVar1) / bivnor::twopi) + cn;
            }
            else {
              cn = ((local_f0 * h2 * (1.0 - h2)) / 2.0) * -1.0 + cn;
            }
          }
          if ((-1 < rr._0_4_) || ((ak == 0.0 && (!NAN(ak))))) break;
          wk = -ak;
          local_f0 = (ah / ak - r) / dVar3;
          h2 = dVar2 * 2.0;
          rr._0_4_ = 1;
        }
        dVar1 = r8_max(cn,0.0);
        ah_local = r8_min(dVar1,1.0);
      }
      else {
        dVar1 = asin(r);
        dVar1 = r8_max(dVar1 / bivnor::twopi + 0.25,0.0);
        ah_local = r8_min(dVar1,1.0);
      }
    }
    else {
      if (0.0 <= r) {
        if (ah - ak < 0.0) {
          dVar1 = dVar2;
        }
        cn = dVar1 * 2.0;
      }
      else if (ah + ak < 0.0) {
        cn = dVar1 + dVar2 + dVar1 + dVar2 + -1.0;
      }
      dVar1 = r8_max(cn,0.0);
      ah_local = r8_min(dVar1,1.0);
    }
  }
  else {
    dVar1 = r8_max(dVar1 * 4.0 * dVar2,0.0);
    ah_local = r8_min(dVar1,1.0);
  }
  return ah_local;
}

Assistant:

double bivnor ( double ah, double ak, double r )

//****************************************************************************80
//
//  Purpose:
//
//    BIVNOR computes the bivariate normal CDF.
//
//  Discussion:
//
//    BIVNOR computes the probability for two normal variates X and Y
//    whose correlation is R, that AH <= X and AK <= Y.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 April 2012
//
//  Author:
//
//    Original FORTRAN77 version by Thomas Donnelly.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Thomas Donnelly,
//    Algorithm 462: Bivariate Normal Distribution,
//    Communications of the ACM,
//    October 1973, Volume 16, Number 10, page 638.
//
//  Parameters:
//
//    Input, double AH, AK, the lower limits of integration.
//
//    Input, double R, the correlation between X and Y.
//
//    Output, double BIVNOR, the bivariate normal CDF.
//
//  Local Parameters:
//
//    Local, int IDIG, the number of significant digits
//    to the right of the decimal point desired in the answer.
//
{
  double a2;
  double ap;
  double b;
  double cn;
  double con;
  double conex;
  double ex;
  double g2;
  double gh;
  double gk;
  double gw = 0.0; // Silence uninitialized warning.
  double h2;
  double h4;
  int i;
  static int idig = 15;
  int is = 0; // Silence uninitialized warning.
  double rr;
  double s1;
  double s2;
  double sgn;
  double sn;
  double sp;
  double sqr;
  double t;
  static double twopi = 6.283185307179587;
  double w2;
  double wh = 0.0; // Silence uninitialized warning.
  double wk = 0.0; // Silence uninitialized warning.

  b = 0.0;

  gh = gauss ( - ah ) / 2.0;
  gk = gauss ( - ak ) / 2.0;

  if ( r == 0.0 )
  {
    b = 4.00 * gh * gk;
    b = r8_max ( b, 0.0 );
    b = r8_min ( b, 1.0 );
    return b;
  }

  rr = ( 1.0 + r ) * ( 1.0 - r );

  if ( rr < 0.0 )
  {
    std::cerr << "\n";
    std::cerr << "BIVNOR - Fatal error!\n";
    std::cerr << "  1 < |R|.\n";
    exit ( 0 );
  }

  if ( rr == 0.0 )
  {
    if ( r < 0.0 )
    {
      if ( ah + ak < 0.0 )
      {
        b = 2.0 * ( gh + gk ) - 1.0;
      }
    }
    else
    {
      if ( ah - ak < 0.0 )
      {
        b = 2.0 * gk;
      }
      else
      {
        b = 2.0 * gh;
      }
    }
    b = r8_max ( b, 0.0 );
    b = r8_min ( b, 1.0 );
    return b;
  }

  sqr = sqrt ( rr );

  if ( idig == 15 )
  {
    con = twopi * 1.0E-15 / 2.0;
  }
  else
  {
    con = twopi / 2.0;
    for ( i = 1; i <= idig; i++ )
    {
      con = con / 10.0;
    }
  }
//
//  (0,0)
//
  if ( ah == 0.0 && ak == 0.0 )
  {
    b = 0.25 + asin ( r ) / twopi;
    b = r8_max ( b, 0.0 );
    b = r8_min ( b, 1.0 );
    return b;
  }
//
//  (0,nonzero)
//
  if ( ah == 0.0 && ak != 0.0 )
  {
    b = gk;
    wh = -ak;
    wk = ( ah / ak - r ) / sqr;
    gw = 2.0 * gk;
    is = 1;
  }
//
//  (nonzero,0)
//
  else if ( ah != 0.0 && ak == 0.0 )
  {
    b = gh;
    wh = -ah;
    wk = ( ak / ah - r ) / sqr;
    gw = 2.0 * gh;
    is = -1;
  }
//
//  (nonzero,nonzero)
//
  else if ( ah != 0.0 && ak != 0.0 )
  {
    b = gh + gk;
    if ( ah * ak < 0.0 )
    {
      b = b - 0.5;
    }
    wh = - ah;
    wk = ( ak / ah - r ) / sqr;
    gw = 2.0 * gh;
    is = -1;
  }

  for ( ; ; )
  {
    sgn = -1.0;
    t = 0.0;

    if ( wk != 0.0 )
    {
      if ( r8_abs ( wk ) == 1.0 )
      {
        t = wk * gw * ( 1.0 - gw ) / 2.0;
        b = b + sgn * t;
      }
      else
      {
        if ( 1.0 < r8_abs ( wk ) )
        {
          sgn = -sgn;
          wh = wh * wk;
          g2 = gauss ( wh );
          wk = 1.0 / wk;

          if ( wk < 0.0 )
          {
            b = b + 0.5;
          }
          b = b - ( gw + g2 ) / 2.0 + gw * g2;
        }
        h2 = wh * wh;
        a2 = wk * wk;
        h4 = h2 / 2.0;
        ex = exp ( - h4 );
        w2 = h4 * ex;
        ap = 1.0;
        s2 = ap - ex;
        sp = ap;
        s1 = 0.0;
        sn = s1;
        conex = r8_abs ( con / wk );

        for ( ; ; )
        {
          cn = ap * s2 / ( sn + sp );
          s1 = s1 + cn;

          if ( r8_abs ( cn ) <= conex )
          {
            break;
          }
          sn = sp;
          sp = sp + 1.0;
          s2 = s2 - w2;
          w2 = w2 * h4 / sp;
          ap = - ap * a2;
        }
        t = ( atan ( wk ) - wk * s1 ) / twopi;
        b = b + sgn * t;
      }
    }
    if ( 0 <= is )
    {
      break;
    }
    if ( ak == 0.0 )
    {
      break;
    }
    wh = -ak;
    wk = ( ah / ak - r ) / sqr;
    gw = 2.0 * gk;
    is = 1;
  }

  b = r8_max ( b, 0.0 );
  b = r8_min ( b, 1.0 );

  return b;
}